

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

long search::go(void)

{
  _Alloc_hider _Var1;
  undefined8 uVar2;
  int iVar3;
  ostream *poVar4;
  long extraout_RAX;
  ulong uVar5;
  SearchInfo *in_RSI;
  Board *in_RDI;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Alloc_hider _Var8;
  Move move;
  PVTable pvtable;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  string local_a8;
  SearchInfo *local_88;
  Board *local_80;
  ulong local_78;
  Move local_70;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  in_RDI->ply = 0;
  local_80 = in_RDI;
  memset(in_RDI->searchHistory,0,0x1a60);
  SearchInfo::reset(in_RSI);
  if (in_RSI->depth == -1 || 0 < in_RSI->depth) {
    uVar5 = 1;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    uVar6 = 0;
    _Var8._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
    local_88 = in_RSI;
    do {
      local_78 = uVar5;
      iVar3 = negamax(-0x7fffffff,0x7ffffffe,(int)uVar5,local_80,local_88,(PVTable *)&local_68);
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var8._M_p;
      local_b0 = uVar6;
      if (local_88->stopped != false) break;
      PVTable::getPV((vector<board::Move,_std::allocator<board::Move>_> *)&local_a8,
                     (PVTable *)&local_68,local_80);
      uVar2 = local_a8.field_2._M_allocated_capacity;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a8._M_string_length;
      _Var1._M_p = local_a8._M_dataplus._M_p;
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_a8._M_dataplus._M_p;
      local_b0 = local_a8.field_2._M_allocated_capacity;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var8._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         (operator_delete(_Var8._M_p,uVar6 - (long)_Var8._M_p),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_a8._M_dataplus._M_p !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        operator_delete(local_a8._M_dataplus._M_p,
                        local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"info score cp ",0xe)
      ;
      std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," depth ",7);
      std::ostream::operator<<((ostream *)&std::cout,(int)local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," nodes ",7);
      std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," time ",6);
      utils::getTime();
      std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," pv",3);
      for (_Var8._M_p = _Var1._M_p;
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != paVar7; _Var8._M_p = _Var8._M_p + 8) {
        local_70 = *(Move *)_Var8._M_p;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        board::Move::getString_abi_cxx11_(&local_a8,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      uVar5 = (ulong)((int)local_78 + 1);
      uVar6 = uVar2;
      _Var8._M_p = _Var1._M_p;
    } while ((int)local_78 < local_88->depth || local_88->depth == -1);
    if (local_b8 != paVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bestmove ",9);
      board::Move::getString_abi_cxx11_(&local_a8,(Move *)&local_b8->_M_allocated_capacity);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_a8._M_dataplus._M_p,local_a8._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_b8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_b8,local_b0 - (long)local_b8);
    }
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return extraout_RAX;
}

Assistant:

void search::go(board::Board& pos, SearchInfo& info)
{
    int score = NEG_INFINITY;
    PVTable pvtable;
    std::vector<board::Move> pv;
    reset(pos, info);
    for (int depth = 1; info.getDepth() == -1 || depth <= info.getDepth(); depth++) {
        score = negamax(NEG_INFINITY, POS_INFINITY, depth, pos, info, pvtable);
        if (info.getStopped()) {
            break;
        }
        pv = pvtable.getPV(pos);
        std::cout << "info score cp " << score;
        std::cout << " depth " << depth;
        std::cout << " nodes " << info.getNodes();
        std::cout << " time " << (utils::getTime() - info.getStartTime());
        std::cout << " pv";
        for (board::Move move : pv) {
            std::cout << " " << move.getString();
        }
        std::cout << std::endl;
    }
    if (!pv.empty()) {
        std::cout << "bestmove " << pv[0].getString() << std::endl;
    }
}